

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HuffmanTree.hpp
# Opt level: O0

void __thiscall kpeg::Node::~Node(Node *this)

{
  long in_RDI;
  
  std::shared_ptr<kpeg::Node>::~shared_ptr((shared_ptr<kpeg::Node> *)0x1716ac);
  std::shared_ptr<kpeg::Node>::~shared_ptr((shared_ptr<kpeg::Node> *)0x1716ba);
  std::shared_ptr<kpeg::Node>::~shared_ptr((shared_ptr<kpeg::Node> *)0x1716c8);
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  return;
}

Assistant:

Node() :
         root{ false } ,
         leaf{ false } ,
         code{ "" } ,
         value{ 0x00 } ,
         lChild{ nullptr } ,
         rChild{ nullptr } ,
         parent{ nullptr }
        {}